

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

vector<MPLSParser,_std::allocator<MPLSParser>_> * __thiscall
METADemuxer::getMplsInfo
          (vector<MPLSParser,_std::allocator<MPLSParser>_> *__return_storage_ptr__,METADemuxer *this
          ,string *mplsFileName)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *this_00;
  ostream *poVar3;
  undefined4 *puVar4;
  pointer __k;
  uint *local_290;
  undefined8 local_288;
  uint local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mplsFiles;
  ostringstream ss;
  MPLSParser parser;
  
  (__return_storage_ptr__->super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  splitQuotedStr_abi_cxx11_(&mplsFiles,(mplsFileName->_M_dataplus)._M_p,'+');
  __k = mplsFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__k == mplsFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&mplsFiles);
      return __return_storage_ptr__;
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
            ::find(&(this->m_mplsStreamMap)._M_t,__k);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->m_mplsStreamMap)._M_t._M_impl.super__Rb_tree_header) {
      MPLSParser::MPLSParser(&parser);
      unquoteStr((string *)&ss,__k);
      bVar1 = MPLSParser::parse(&parser,_ss);
      std::__cxx11::string::~string((string *)&ss);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Can\'t parse play list file ");
        std::operator<<(poVar3,(string *)__k);
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 3;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_290 == &local_280) {
          puVar4[6] = local_280;
          puVar4[7] = uStack_27c;
          puVar4[8] = uStack_278;
          puVar4[9] = uStack_274;
        }
        else {
          *(uint **)(puVar4 + 2) = local_290;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_27c,local_280);
        }
        *(undefined8 *)(puVar4 + 4) = local_288;
        local_280 = local_280 & 0xffffff00;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
                ::operator[](&this->m_mplsStreamMap,__k);
      MPLSParser::operator=(this_00,&parser);
      std::vector<MPLSParser,_std::allocator<MPLSParser>_>::push_back
                (__return_storage_ptr__,&parser);
      MPLSParser::~MPLSParser(&parser);
    }
    else {
      std::vector<MPLSParser,_std::allocator<MPLSParser>_>::push_back
                (__return_storage_ptr__,(value_type *)(iVar2._M_node + 2));
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

std::vector<MPLSParser> METADemuxer::getMplsInfo(const string& mplsFileName)
{
    std::vector<MPLSParser> result;

    std::vector<std::string> mplsFiles = splitQuotedStr(mplsFileName.c_str(), '+');
    for (auto& i : mplsFiles)
    {
        auto itr = m_mplsStreamMap.find(i);
        if (itr != m_mplsStreamMap.end())
            result.push_back(itr->second);
        else
        {
            MPLSParser parser;
            if (!parser.parse(unquoteStr(i).c_str()))
                THROW(ERR_COMMON, "Can't parse play list file " << i)
            m_mplsStreamMap[i] = parser;
            result.push_back(parser);
        }
    }
    return result;
}